

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::objectivec::ReadLine(StringPiece *input,StringPiece *line)

{
  char c;
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  const_pointer pcVar4;
  long lVar5;
  StringPiece local_48;
  StringPiece local_38;
  int local_24;
  StringPiece *pSStack_20;
  int len;
  StringPiece *line_local;
  StringPiece *input_local;
  
  local_24 = 0;
  pSStack_20 = line;
  line_local = input;
  while( true ) {
    uVar2 = (ulong)local_24;
    sVar3 = stringpiece_internal::StringPiece::size(line_local);
    if (sVar3 <= uVar2) {
      return false;
    }
    c = stringpiece_internal::StringPiece::operator[](line_local,(long)local_24);
    bVar1 = anon_unknown_0::ascii_isnewline(c);
    if (bVar1) break;
    local_24 = local_24 + 1;
  }
  pcVar4 = stringpiece_internal::StringPiece::data(line_local);
  stringpiece_internal::StringPiece::StringPiece(&local_38,pcVar4,(long)local_24);
  pSStack_20->ptr_ = local_38.ptr_;
  pSStack_20->length_ = local_38.length_;
  local_24 = local_24 + 1;
  pcVar4 = stringpiece_internal::StringPiece::data(line_local);
  lVar5 = (long)local_24;
  sVar3 = stringpiece_internal::StringPiece::size(line_local);
  stringpiece_internal::StringPiece::StringPiece(&local_48,pcVar4 + lVar5,sVar3 - (long)local_24);
  line_local->ptr_ = local_48.ptr_;
  line_local->length_ = local_48.length_;
  return true;
}

Assistant:

bool ReadLine(StringPiece* input, StringPiece* line) {
  for (int len = 0; len < input->size(); ++len) {
    if (ascii_isnewline((*input)[len])) {
      *line = StringPiece(input->data(), len);
      ++len;  // advance over the newline
      *input = StringPiece(input->data() + len, input->size() - len);
      return true;
    }
  }
  return false;  // Ran out of input with no newline.
}